

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

uint8_t place_tantegel(dw_map *map,int largest,int next)

{
  byte bVar1;
  byte bVar2;
  dw_border_tile dVar3;
  uint uVar4;
  uint uVar5;
  BOOL BVar6;
  dw_border_tile old_tile;
  dw_warp *warp;
  int y;
  int x;
  int next_local;
  int largest_local;
  dw_map *map_local;
  
  dVar3 = place(map,WARP_TANTEGEL,TILE_CASTLE,largest,next);
  bVar1 = map->warps_from[4].x;
  uVar4 = (uint)bVar1;
  bVar2 = map->warps_from[4].y;
  uVar5 = (uint)bVar2;
  map->love_calc->x = bVar1;
  map->love_calc->y = bVar2;
  if ((uVar5 < 0x77) &&
     (BVar6 = tile_is_walkable((uint)map->tiles[(int)uVar4][(int)(uVar5 + 1)]), BVar6 != FALSE)) {
    map->return_point->x = bVar1;
    map->return_point->y = bVar2 + 1;
  }
  else if ((uVar5 == 0) ||
          (BVar6 = tile_is_walkable((uint)map->tiles[(int)uVar4][(int)(uVar5 - 1)]), BVar6 == FALSE)
          ) {
    if ((uVar4 == 0) ||
       (BVar6 = tile_is_walkable((uint)map->tiles[(int)(uVar4 - 1)][(int)uVar5]), BVar6 == FALSE)) {
      if ((uVar4 < 0x77) &&
         (BVar6 = tile_is_walkable((uint)map->tiles[(int)(uVar4 + 1)][(int)uVar5]), BVar6 != FALSE))
      {
        map->return_point->x = bVar1 + 1;
        map->return_point->y = bVar2;
      }
    }
    else {
      map->return_point->x = bVar1 - 1;
      map->return_point->y = bVar2;
    }
  }
  else {
    map->return_point->x = bVar1;
    map->return_point->y = bVar2 - 1;
  }
  map->meta[4].border = (uint8_t)dVar3;
  return map->walkable[(int)uVar4][(int)uVar5];
}

Assistant:

static uint8_t place_tantegel(dw_map *map, int largest, int next)
{
    int x, y;
    dw_warp *warp;
    dw_border_tile old_tile;

    old_tile = place(map, WARP_TANTEGEL, TILE_CASTLE, largest, next);
    warp = &map->warps_from[WARP_TANTEGEL];
    x = warp->x;
    y = warp->y;

    map->love_calc->x = x;
    map->love_calc->y = y;
    if (y < 119 && tile_is_walkable(map->tiles[x][y+1])) { 
        map->return_point->x = x;
        map->return_point->y = y+1;
    } else if (y > 0 && tile_is_walkable(map->tiles[x][y-1])) { 
        map->return_point->x = x;
        map->return_point->y = y-1;
    } else if (x > 0 && tile_is_walkable(map->tiles[x-1][y])) { 
        map->return_point->x = x-1;
        map->return_point->y = y;
    } else if (x < 119 && tile_is_walkable(map->tiles[x+1][y])) { 
        map->return_point->x = x+1;
        map->return_point->y = y;
    }
    /* do some stuff */
    map->meta[TANTEGEL].border = old_tile;
    return map->walkable[x][y];
}